

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_write_multiple_bufs(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  __off64_t _Var6;
  uv_buf_t *bufs;
  char *pcVar7;
  int in_EDI;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  uv_buf_t uVar11;
  char acStack_ca [2];
  uv_loop_t *puStack_c8;
  uv_buf_t uStack_40;
  uv_buf_t uStack_30;
  uv_loop_t *puStack_18;
  
  fs_write_multiple_bufs(in_EDI);
  fs_write_multiple_bufs(in_EDI);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_write_multiple_bufs_cold_1();
  puStack_18 = puVar4;
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar3 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_0015f0a0:
    fs_write_multiple_bufs_cold_2();
LAB_0015f0a5:
    fs_write_multiple_bufs_cold_3();
LAB_0015f0aa:
    fs_write_multiple_bufs_cold_4();
LAB_0015f0af:
    fs_write_multiple_bufs_cold_5();
LAB_0015f0b4:
    fs_write_multiple_bufs_cold_6();
LAB_0015f0b9:
    fs_write_multiple_bufs_cold_7();
LAB_0015f0be:
    fs_write_multiple_bufs_cold_8();
LAB_0015f0c3:
    fs_write_multiple_bufs_cold_9();
LAB_0015f0c8:
    fs_write_multiple_bufs_cold_10();
LAB_0015f0cd:
    fs_write_multiple_bufs_cold_11();
LAB_0015f0d2:
    fs_write_multiple_bufs_cold_12();
LAB_0015f0d7:
    fs_write_multiple_bufs_cold_13();
LAB_0015f0dc:
    fs_write_multiple_bufs_cold_14();
LAB_0015f0e1:
    fs_write_multiple_bufs_cold_15();
LAB_0015f0e6:
    fs_write_multiple_bufs_cold_16();
LAB_0015f0eb:
    fs_write_multiple_bufs_cold_19();
LAB_0015f0f0:
    fs_write_multiple_bufs_cold_20();
LAB_0015f0f5:
    fs_write_multiple_bufs_cold_21();
LAB_0015f0fa:
    fs_write_multiple_bufs_cold_22();
LAB_0015f0ff:
    fs_write_multiple_bufs_cold_23();
LAB_0015f104:
    fs_write_multiple_bufs_cold_24();
LAB_0015f109:
    fs_write_multiple_bufs_cold_25();
LAB_0015f10e:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015f0a0;
    uv_fs_req_cleanup(&open_req1);
    uStack_40 = uv_buf_init(test_buf,0xd);
    uStack_30 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&uStack_40,2,0,
                        (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015f0a5;
    if (write_req.result < 0) goto LAB_0015f0aa;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015f0af;
    if (close_req.result != 0) goto LAB_0015f0b4;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015f0b9;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f0be;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    uStack_40 = uv_buf_init(buf,0xd);
    uStack_30 = uv_buf_init(buf2,0xf);
    iVar2 = (uv_file)open_req1.result;
    _Var6 = lseek64((uv_file)open_req1.result,0,1);
    if (_Var6 != 0) goto LAB_0015f0c3;
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_40,2,-1,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015f0c8;
    if (read_req.result != 0x1c) goto LAB_0015f0cd;
    iVar2 = 0x3120e0;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_0015f0d2;
    iVar2 = 0x3140d0;
    iVar3 = strcmp(buf2,test_buf2);
    if (iVar3 != 0) goto LAB_0015f0d7;
    uv_fs_req_cleanup(&read_req);
    iov = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar3 != 0) goto LAB_0015f0dc;
    if (read_req.result != 0) goto LAB_0015f0e1;
    uv_fs_req_cleanup(&read_req);
    uStack_40 = uv_buf_init(buf,0xd);
    uStack_30 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_40,2,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015f0e6;
    if (read_req.result == 0x1c) {
LAB_0015ef9e:
      iVar2 = 0x3120e0;
      iVar3 = strcmp(buf,test_buf);
      if (iVar3 != 0) goto LAB_0015f0eb;
      iVar2 = 0x3140d0;
      iVar3 = strcmp(buf2,test_buf2);
      if (iVar3 != 0) goto LAB_0015f0f0;
      uv_fs_req_cleanup(&read_req);
      uVar11 = uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar11;
      iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0x1c,
                         (uv_fs_cb)0x0);
      if (iVar3 != 0) goto LAB_0015f0f5;
      if (read_req.result != 0) goto LAB_0015f0fa;
      uv_fs_req_cleanup(&read_req);
      iVar2 = 0;
      iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
      if (iVar3 != 0) goto LAB_0015f0ff;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        iVar2 = unlink("test_file");
        return iVar2;
      }
      goto LAB_0015f104;
    }
    if (read_req.result != 0xd) goto LAB_0015f109;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_30,1,
                       read_req.result,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015f10e;
    if (read_req.result == 0xf) goto LAB_0015ef9e;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0xd4310;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_0015f495:
    fs_write_alotof_bufs_cold_18();
LAB_0015f49a:
    fs_write_alotof_bufs_cold_1();
LAB_0015f49f:
    fs_write_alotof_bufs_cold_2();
LAB_0015f4a4:
    fs_write_alotof_bufs_cold_3();
LAB_0015f4a9:
    fs_write_alotof_bufs_cold_4();
LAB_0015f4ae:
    fs_write_alotof_bufs_cold_17();
LAB_0015f4b3:
    fs_write_alotof_bufs_cold_5();
LAB_0015f4b8:
    fs_write_alotof_bufs_cold_6();
LAB_0015f4bd:
    fs_write_alotof_bufs_cold_7();
LAB_0015f4c2:
    fs_write_alotof_bufs_cold_8();
LAB_0015f4c7:
    fs_write_alotof_bufs_cold_9();
LAB_0015f4cc:
    fs_write_alotof_bufs_cold_10();
LAB_0015f4d1:
    fs_write_alotof_bufs_cold_12();
LAB_0015f4d6:
    fs_write_alotof_bufs_cold_13();
LAB_0015f4db:
    fs_write_alotof_bufs_cold_14();
LAB_0015f4e0:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015f49a;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f49f;
    uv_fs_req_cleanup(&open_req1);
    lVar9 = 8;
    do {
      uVar11 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar9 + -8) = uVar11.base;
      *(size_t *)((long)&bufs->base + lVar9) = uVar11.len;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                        (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015f4a4;
    if (write_req.result != 0xac67d) goto LAB_0015f4a9;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pcVar7 = (char *)malloc(0xac67d);
    if (pcVar7 == (char *)0x0) goto LAB_0015f4ae;
    lVar9 = 8;
    pcVar10 = pcVar7;
    do {
      uVar11 = uv_buf_init(pcVar10,0xd);
      *(char **)((long)bufs + lVar9 + -8) = uVar11.base;
      *(size_t *)((long)&bufs->base + lVar9) = uVar11.len;
      lVar9 = lVar9 + 0x10;
      pcVar10 = pcVar10 + 0xd;
    } while (lVar9 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015f4b3;
    if (close_req.result != 0) goto LAB_0015f4b8;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015f4bd;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f4c2;
    uv_fs_req_cleanup(&open_req1);
    iVar2 = 0;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015f4c7;
    if (read_req.result != 0x3400) goto LAB_0015f4cc;
    lVar9 = 0;
    do {
      pcVar10 = pcVar7 + lVar9;
      iVar3 = strncmp(pcVar10,test_buf,0xd);
      iVar2 = (int)pcVar10;
      if (iVar3 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_0015f495;
      }
      lVar9 = lVar9 + 0xd;
    } while (lVar9 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pcVar7);
    iVar2 = (uv_file)open_req1.result;
    _Var6 = lseek64((uv_file)open_req1.result,write_req.result,0);
    if (_Var6 != write_req.result) goto LAB_0015f4d1;
    uVar11 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar11;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar3 != 0) goto LAB_0015f4d6;
    if (read_req.result != 0) goto LAB_0015f4db;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015f4e0;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(bufs);
      return extraout_EAX;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_c8 = (uv_loop_t *)0x15f54e;
  unlink("test_file");
  puStack_c8 = (uv_loop_t *)0x15f553;
  loop = uv_default_loop();
  puStack_c8 = (uv_loop_t *)0x15f564;
  puVar5 = (uv_loop_t *)malloc(0xd4310);
  if (puVar5 == (uv_loop_t *)0x0) {
LAB_0015f8a9:
    puVar5 = puVar4;
    puStack_c8 = (uv_loop_t *)0x15f8ae;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_0015f8ae:
    puStack_c8 = (uv_loop_t *)0x15f8b3;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_0015f8b3:
    puStack_c8 = (uv_loop_t *)0x15f8b8;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015f8b8:
    puStack_c8 = (uv_loop_t *)0x15f8bd;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_0015f8bd:
    puStack_c8 = (uv_loop_t *)0x15f8c2;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_0015f8c2:
    puStack_c8 = (uv_loop_t *)0x15f8c7;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_0015f8c7:
    puStack_c8 = (uv_loop_t *)0x15f8cc;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_0015f8cc:
    puStack_c8 = (uv_loop_t *)0x15f8d1;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_0015f8d1:
    puStack_c8 = (uv_loop_t *)0x15f8d6;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_0015f8d6:
    puStack_c8 = (uv_loop_t *)0x15f8db;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_0015f8db:
    puStack_c8 = (uv_loop_t *)0x15f8e0;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_0015f8e0:
    puStack_c8 = (uv_loop_t *)0x15f8e5;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0015f8e5:
    puStack_c8 = (uv_loop_t *)0x15f8ea;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_0015f8ea:
    puStack_c8 = (uv_loop_t *)0x15f8ef;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_0015f8ef:
    puStack_c8 = (uv_loop_t *)0x15f8f4;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_c8 = (uv_loop_t *)0x15f593;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f8ae;
    if (open_req1.result._4_4_ < 0) goto LAB_0015f8b3;
    puStack_c8 = (uv_loop_t *)0x15f5b5;
    uv_fs_req_cleanup(&open_req1);
    puStack_c8 = (uv_loop_t *)0x15f5c6;
    uVar11 = uv_buf_init("0123456789",10);
    puStack_c8 = (uv_loop_t *)0x15f604;
    iov = uVar11;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 != 10) goto LAB_0015f8b8;
    if (write_req.result != 10) goto LAB_0015f8bd;
    puStack_c8 = (uv_loop_t *)0x15f627;
    uv_fs_req_cleanup(&write_req);
    lVar9 = 8;
    do {
      puStack_c8 = (uv_loop_t *)0x15f641;
      uVar11 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar5->handle_queue + lVar9 + -0x18) = uVar11.base;
      *(size_t *)((long)puVar5->handle_queue + lVar9 + -0x10) = uVar11.len;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0xd4318);
    puStack_c8 = (uv_loop_t *)0x15f682;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,(uv_buf_t *)puVar5,
                        0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f8c2;
    if (write_req.result != 0xac67d) goto LAB_0015f8c7;
    puStack_c8 = (uv_loop_t *)0x15f6a7;
    uv_fs_req_cleanup(&write_req);
    puStack_c8 = (uv_loop_t *)0x15f6b1;
    pcVar7 = (char *)malloc(0xac67d);
    if (pcVar7 == (char *)0x0) goto LAB_0015f8cc;
    lVar9 = 8;
    pcVar10 = pcVar7;
    do {
      puStack_c8 = (uv_loop_t *)0x15f6d3;
      uVar11 = uv_buf_init(pcVar10,0xd);
      *(char **)((long)puVar5->handle_queue + lVar9 + -0x18) = uVar11.base;
      *(size_t *)((long)puVar5->handle_queue + lVar9 + -0x10) = uVar11.len;
      lVar9 = lVar9 + 0x10;
      pcVar10 = pcVar10 + 0xd;
    } while (lVar9 != 0xd4318);
    puStack_c8 = (uv_loop_t *)0x15f718;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)puVar5,
                       0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015f8d1;
    lVar9 = 0xd;
    if (iVar2 != 0xd) {
      lVar9 = 0x3400;
    }
    if (read_req.result != lVar9) goto LAB_0015f8d6;
    pcVar10 = pcVar7;
    uVar8 = 0;
    do {
      puStack_c8 = (uv_loop_t *)0x15f75d;
      iVar3 = strncmp(pcVar10,test_buf,0xd);
      if (iVar3 != 0) {
        puStack_c8 = (uv_loop_t *)0x15f8a9;
        fs_write_alotof_bufs_with_offset_cold_9();
        puVar4 = puVar5;
        goto LAB_0015f8a9;
      }
      if (iVar2 == 0xd) break;
      pcVar10 = pcVar10 + 0xd;
      bVar1 = uVar8 < 0x3ff;
      uVar8 = uVar8 + 1;
    } while (bVar1);
    puStack_c8 = (uv_loop_t *)0x15f78a;
    uv_fs_req_cleanup(&read_req);
    puStack_c8 = (uv_loop_t *)0x15f792;
    free(pcVar7);
    puStack_c8 = (uv_loop_t *)0x15f7a9;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f8db;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_0015f8e0;
    puStack_c8 = (uv_loop_t *)0x15f7d9;
    uv_fs_req_cleanup(&stat_req);
    puStack_c8 = (uv_loop_t *)0x15f7ea;
    uVar11 = uv_buf_init(buf,0x20);
    puStack_c8 = (uv_loop_t *)0x15f82c;
    iov = uVar11;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f8e5;
    if (read_req.result != 0) goto LAB_0015f8ea;
    puStack_c8 = (uv_loop_t *)0x15f84e;
    uv_fs_req_cleanup(&read_req);
    puStack_c8 = (uv_loop_t *)0x15f864;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f8ef;
    if (close_req.result == 0) {
      puStack_c8 = (uv_loop_t *)0x15f882;
      uv_fs_req_cleanup(&close_req);
      puStack_c8 = (uv_loop_t *)0x15f88e;
      unlink("test_file");
      free(puVar5);
      return extraout_EAX_00;
    }
  }
  puStack_c8 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_c8 = puVar5;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_0015fa70;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015fa75;
    uv_fs_req_cleanup(&open_req1);
    uVar11 = uv_buf_init(acStack_ca,2);
    iov = uVar11;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x15) goto LAB_0015fa7a;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0015fa84;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015fa70:
    run_test_fs_read_dir_cold_2();
LAB_0015fa75:
    run_test_fs_read_dir_cold_3();
LAB_0015fa7a:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_0015fa84:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_write_multiple_bufs) {
  fs_write_multiple_bufs(0);
  fs_write_multiple_bufs(UV_FS_O_FILEMAP);

  MAKE_VALGRIND_HAPPY();
  return 0;
}